

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range_map_test.cc
# Opt level: O0

void __thiscall bloaty::RangeMapTest_Translation_Test::TestBody(RangeMapTest_Translation_Test *this)

{
  initializer_list<bloaty::RangeMapTest::Entry> __l;
  initializer_list<bloaty::RangeMapTest::Entry> __l_00;
  initializer_list<bloaty::RangeMapTest::Entry> __l_01;
  initializer_list<bloaty::RangeMapTest::Entry> __l_02;
  initializer_list<bloaty::RangeMapTest::Entry> __l_03;
  undefined1 uVar1;
  bool bVar2;
  uint64_t addr;
  char *message;
  bool *pbVar3;
  long in_RDI;
  AssertionResult gtest_ar__4;
  AssertionResult gtest_ar__3;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_>
  *in_stack_fffffffffffff818;
  RangeMapTest *in_stack_fffffffffffff820;
  vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_>
  *in_stack_fffffffffffff830;
  undefined8 in_stack_fffffffffffff838;
  int iVar4;
  undefined6 in_stack_fffffffffffff840;
  undefined1 in_stack_fffffffffffff846;
  undefined1 uVar5;
  undefined1 in_stack_fffffffffffff847;
  allocator_type *in_stack_fffffffffffff848;
  Type TVar6;
  allocator<char> *in_stack_fffffffffffff850;
  allocator<char> *__a;
  iterator in_stack_fffffffffffff858;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff860;
  undefined1 in_stack_fffffffffffff86f;
  RangeMap *in_stack_fffffffffffff870;
  string *in_stack_fffffffffffff878;
  char *in_stack_fffffffffffff880;
  char *in_stack_fffffffffffff888;
  RangeMap *in_stack_fffffffffffff890;
  AssertionResult *in_stack_fffffffffffff898;
  RangeMap *in_stack_fffffffffffff8a0;
  undefined8 ***local_730;
  undefined8 ***local_6e8;
  undefined8 ***local_628;
  undefined8 **local_5f0;
  vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_> *entries;
  RangeMap *in_stack_fffffffffffffa38;
  RangeMapTest *in_stack_fffffffffffffa40;
  string *in_stack_fffffffffffffa50;
  uint64_t in_stack_fffffffffffffa58;
  undefined6 in_stack_fffffffffffffa60;
  undefined1 in_stack_fffffffffffffa66;
  undefined1 in_stack_fffffffffffffa67;
  uint64_t in_stack_fffffffffffffa68;
  RangeMap *in_stack_fffffffffffffa70;
  RangeMap *this_00;
  undefined8 ***local_578;
  string local_540 [55];
  allocator<char> local_509;
  string local_508 [39];
  byte local_4e1;
  AssertionResult local_4e0;
  string local_4d0 [55];
  allocator<char> local_499;
  string local_498 [39];
  byte local_471;
  AssertionResult local_470;
  string local_460 [55];
  allocator<char> local_429;
  string local_428 [39];
  byte local_401;
  AssertionResult local_400;
  undefined1 local_3eb;
  allocator<char> local_3ea;
  allocator<char> local_3e9;
  undefined8 **local_3e8;
  undefined8 **local_3e0;
  undefined8 local_3d8;
  undefined8 local_3d0;
  undefined8 local_3a8;
  undefined8 local_3a0;
  undefined8 local_398;
  undefined8 **local_370;
  undefined8 local_368;
  undefined1 local_343;
  allocator<char> local_342;
  allocator<char> local_341;
  undefined8 **local_340;
  undefined8 **local_338;
  undefined8 local_330;
  undefined8 local_328;
  undefined8 local_300;
  undefined8 local_2f8;
  undefined8 local_2f0;
  undefined8 **local_2c8;
  undefined8 local_2c0;
  string local_2a0 [55];
  allocator<char> local_269;
  string local_268 [39];
  undefined1 local_241;
  AssertionResult local_240;
  allocator<char> local_229;
  string local_228 [38];
  undefined1 local_202;
  allocator<char> local_201;
  undefined8 **local_200;
  undefined8 **local_1f8;
  undefined8 local_1f0;
  undefined8 local_1e8;
  undefined8 **local_1c0;
  undefined8 local_1b8;
  undefined1 local_192;
  undefined1 local_191 [25];
  undefined8 local_178;
  undefined8 *local_150;
  undefined8 local_148;
  uint local_124;
  string local_120 [55];
  undefined1 local_e9 [40];
  undefined1 local_c1;
  AssertionResult local_c0;
  undefined1 local_aa;
  allocator<char> local_a9;
  undefined8 **local_a8;
  undefined8 **local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 **local_68;
  undefined8 local_60;
  allocator<char> local_29;
  string local_28 [40];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff860,(char *)in_stack_fffffffffffff858,in_stack_fffffffffffff850);
  RangeMap::AddDualRange
            (in_stack_fffffffffffffa70,in_stack_fffffffffffffa68,
             CONCAT17(in_stack_fffffffffffffa67,
                      CONCAT16(in_stack_fffffffffffffa66,in_stack_fffffffffffffa60)),
             in_stack_fffffffffffffa58,in_stack_fffffffffffffa50);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator(&local_29);
  RangeMapTest::CheckConsistency(in_stack_fffffffffffff820);
  local_aa = 1;
  local_a8 = &local_a0;
  local_a0 = (undefined8 **)0x14;
  local_98 = 0x19;
  local_90 = 0x78;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff860,(char *)in_stack_fffffffffffff858,in_stack_fffffffffffff850);
  local_aa = 0;
  local_68 = &local_a0;
  local_60 = 1;
  std::allocator<bloaty::RangeMapTest::Entry>::allocator
            ((allocator<bloaty::RangeMapTest::Entry> *)0x17d403);
  __l._M_len = (size_type)in_stack_fffffffffffff860;
  __l._M_array = in_stack_fffffffffffff858;
  std::vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_>::vector
            ((vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_> *)
             in_stack_fffffffffffff850,__l,in_stack_fffffffffffff848);
  RangeMapTest::AssertMainMapEquals(in_stack_fffffffffffff820,in_stack_fffffffffffff818);
  std::vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_>::~vector
            (in_stack_fffffffffffff830);
  std::allocator<bloaty::RangeMapTest::Entry>::~allocator
            ((allocator<bloaty::RangeMapTest::Entry> *)0x17d45b);
  local_578 = &local_68;
  do {
    local_578 = local_578 + -7;
    RangeMapTest::Entry::~Entry((Entry *)0x17d490);
  } while (local_578 != &local_a0);
  std::allocator<char>::~allocator(&local_a9);
  addr = in_RDI + 0x40;
  this_00 = (RangeMap *)local_e9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff860,(char *)in_stack_fffffffffffff858,in_stack_fffffffffffff850);
  pbVar3 = (bool *)(in_RDI + 0x70);
  uVar1 = RangeMap::AddRangeWithTranslation
                    (in_stack_fffffffffffff890,(uint64_t)in_stack_fffffffffffff888,
                     (uint64_t)in_stack_fffffffffffff880,in_stack_fffffffffffff878,
                     in_stack_fffffffffffff870,(bool)in_stack_fffffffffffff86f,
                     in_stack_fffffffffffff8a0);
  local_c1 = uVar1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffff820,pbVar3,(type *)0x17d56e);
  std::__cxx11::string::~string((string *)(local_e9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_e9);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_c0);
  uVar5 = bVar2;
  if (!bVar2) {
    testing::Message::Message((Message *)in_stack_fffffffffffff850);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff898,(char *)in_stack_fffffffffffff890,in_stack_fffffffffffff888
               ,in_stack_fffffffffffff880);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff850,
               (Type)((ulong)in_stack_fffffffffffff848 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffff847,
                                CONCAT16(in_stack_fffffffffffff846,in_stack_fffffffffffff840)),
               (int)((ulong)in_stack_fffffffffffff838 >> 0x20),(char *)in_stack_fffffffffffff830);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff8a0,(Message *)in_stack_fffffffffffff898);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff820);
    std::__cxx11::string::~string(local_120);
    testing::Message::~Message((Message *)0x17d82d);
  }
  local_124 = (uint)!bVar2;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x17d8be);
  if (local_124 == 0) {
    RangeMapTest::CheckConsistency(in_stack_fffffffffffff820);
    local_192 = 1;
    local_191._1_8_ = local_191 + 9;
    local_191._9_8_ = 0x14;
    local_191._17_8_ = 0x19;
    local_178 = *(undefined8 *)(in_RDI + 0xa0);
    entries = (vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_> *)
              local_191;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff860,(char *)in_stack_fffffffffffff858,in_stack_fffffffffffff850
              );
    local_192 = 0;
    local_150 = (undefined8 *)(local_191 + 9);
    local_148 = 1;
    std::allocator<bloaty::RangeMapTest::Entry>::allocator
              ((allocator<bloaty::RangeMapTest::Entry> *)0x17d9af);
    __l_00._M_len = (size_type)in_stack_fffffffffffff860;
    __l_00._M_array = in_stack_fffffffffffff858;
    std::vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_>::vector
              ((vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_> *)
               in_stack_fffffffffffff850,__l_00,in_stack_fffffffffffff848);
    RangeMapTest::AssertMapEquals(in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,entries);
    std::vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_>::~vector
              (in_stack_fffffffffffff830);
    std::allocator<bloaty::RangeMapTest::Entry>::~allocator
              ((allocator<bloaty::RangeMapTest::Entry> *)0x17da0f);
    local_5f0 = &local_150;
    do {
      local_5f0 = local_5f0 + -7;
      RangeMapTest::Entry::~Entry((Entry *)0x17da44);
    } while (local_5f0 != (undefined8 **)(local_191 + 9));
    std::allocator<char>::~allocator((allocator<char> *)local_191);
    local_202 = 1;
    local_200 = &local_1f8;
    local_1f8 = (undefined8 **)0x78;
    local_1f0 = 0x7d;
    local_1e8 = *(undefined8 *)(in_RDI + 0xa0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff860,(char *)in_stack_fffffffffffff858,in_stack_fffffffffffff850
              );
    local_202 = 0;
    local_1c0 = &local_1f8;
    local_1b8 = 1;
    std::allocator<bloaty::RangeMapTest::Entry>::allocator
              ((allocator<bloaty::RangeMapTest::Entry> *)0x17db40);
    __l_01._M_len = (size_type)in_stack_fffffffffffff860;
    __l_01._M_array = in_stack_fffffffffffff858;
    std::vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_>::vector
              ((vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_> *)
               in_stack_fffffffffffff850,__l_01,in_stack_fffffffffffff848);
    RangeMapTest::AssertMapEquals(in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,entries);
    std::vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_>::~vector
              (in_stack_fffffffffffff830);
    std::allocator<bloaty::RangeMapTest::Entry>::~allocator
              ((allocator<bloaty::RangeMapTest::Entry> *)0x17dba0);
    local_628 = &local_1c0;
    do {
      local_628 = local_628 + -7;
      RangeMapTest::Entry::~Entry((Entry *)0x17dbd5);
    } while (local_628 != &local_1f8);
    std::allocator<char>::~allocator(&local_201);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff860,(char *)in_stack_fffffffffffff858,in_stack_fffffffffffff850
              );
    RangeMap::AddDualRange
              (this_00,addr,CONCAT17(uVar1,CONCAT16(uVar5,in_stack_fffffffffffffa60)),
               in_stack_fffffffffffffa58,in_stack_fffffffffffffa50);
    std::__cxx11::string::~string(local_228);
    std::allocator<char>::~allocator(&local_229);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff860,(char *)in_stack_fffffffffffff858,in_stack_fffffffffffff850
              );
    pbVar3 = (bool *)(in_RDI + 0x70);
    local_241 = RangeMap::AddRangeWithTranslation
                          (in_stack_fffffffffffff890,(uint64_t)in_stack_fffffffffffff888,
                           (uint64_t)in_stack_fffffffffffff880,in_stack_fffffffffffff878,
                           in_stack_fffffffffffff870,(bool)in_stack_fffffffffffff86f,
                           in_stack_fffffffffffff8a0);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffff820,pbVar3,(type *)0x17dd3a);
    std::__cxx11::string::~string(local_268);
    std::allocator<char>::~allocator(&local_269);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_240);
    if (!bVar2) {
      testing::Message::Message((Message *)in_stack_fffffffffffff850);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (in_stack_fffffffffffff898,(char *)in_stack_fffffffffffff890,
                 in_stack_fffffffffffff888,in_stack_fffffffffffff880);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffff850,
                 (Type)((ulong)in_stack_fffffffffffff848 >> 0x20),
                 (char *)CONCAT17(in_stack_fffffffffffff847,
                                  CONCAT16(in_stack_fffffffffffff846,in_stack_fffffffffffff840)),
                 (int)((ulong)in_stack_fffffffffffff838 >> 0x20),(char *)in_stack_fffffffffffff830);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)in_stack_fffffffffffff8a0,(Message *)in_stack_fffffffffffff898);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff820);
      std::__cxx11::string::~string(local_2a0);
      testing::Message::~Message((Message *)0x17e12f);
    }
    local_124 = (uint)!bVar2;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x17e1c0);
    if (local_124 == 0) {
      local_343 = 1;
      local_340 = &local_338;
      local_338 = (undefined8 **)0x14;
      local_330 = 0x19;
      local_328 = *(undefined8 *)(in_RDI + 0xa0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff860,(char *)in_stack_fffffffffffff858,
                 in_stack_fffffffffffff850);
      local_340 = (undefined8 **)&local_300;
      local_300 = 1000;
      local_2f8 = 0x3ed;
      local_2f0 = *(undefined8 *)(in_RDI + 0xa0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff860,(char *)in_stack_fffffffffffff858,
                 in_stack_fffffffffffff850);
      local_343 = 0;
      local_2c8 = &local_338;
      local_2c0 = 2;
      std::allocator<bloaty::RangeMapTest::Entry>::allocator
                ((allocator<bloaty::RangeMapTest::Entry> *)0x17e326);
      __l_02._M_len = (size_type)in_stack_fffffffffffff860;
      __l_02._M_array = in_stack_fffffffffffff858;
      std::vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_>::vector
                ((vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_>
                  *)in_stack_fffffffffffff850,__l_02,in_stack_fffffffffffff848);
      RangeMapTest::AssertMapEquals(in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,entries);
      std::vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_>::
      ~vector(in_stack_fffffffffffff830);
      std::allocator<bloaty::RangeMapTest::Entry>::~allocator
                ((allocator<bloaty::RangeMapTest::Entry> *)0x17e386);
      local_6e8 = &local_2c8;
      do {
        local_6e8 = local_6e8 + -7;
        RangeMapTest::Entry::~Entry((Entry *)0x17e3bb);
      } while (local_6e8 != &local_338);
      std::allocator<char>::~allocator(&local_342);
      std::allocator<char>::~allocator(&local_341);
      local_3eb = 1;
      local_3e8 = &local_3e0;
      local_3e0 = (undefined8 **)0x78;
      local_3d8 = 0x7d;
      local_3d0 = *(undefined8 *)(in_RDI + 0xa0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff860,(char *)in_stack_fffffffffffff858,
                 in_stack_fffffffffffff850);
      local_3e8 = (undefined8 **)&local_3a8;
      local_3a8 = 0x44c;
      local_3a0 = 0x451;
      local_398 = *(undefined8 *)(in_RDI + 0xa0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff860,(char *)in_stack_fffffffffffff858,
                 in_stack_fffffffffffff850);
      local_3eb = 0;
      local_370 = &local_3e0;
      local_368 = 2;
      std::allocator<bloaty::RangeMapTest::Entry>::allocator
                ((allocator<bloaty::RangeMapTest::Entry> *)0x17e546);
      __l_03._M_len = (size_type)in_stack_fffffffffffff860;
      __l_03._M_array = in_stack_fffffffffffff858;
      std::vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_>::vector
                ((vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_>
                  *)in_stack_fffffffffffff850,__l_03,in_stack_fffffffffffff848);
      RangeMapTest::AssertMapEquals(in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,entries);
      std::vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_>::
      ~vector(in_stack_fffffffffffff830);
      std::allocator<bloaty::RangeMapTest::Entry>::~allocator
                ((allocator<bloaty::RangeMapTest::Entry> *)0x17e5a6);
      local_730 = &local_370;
      do {
        local_730 = local_730 + -7;
        RangeMapTest::Entry::~Entry((Entry *)0x17e5db);
        iVar4 = (int)((ulong)in_stack_fffffffffffff838 >> 0x20);
        TVar6 = (Type)((ulong)in_stack_fffffffffffff848 >> 0x20);
      } while (local_730 != &local_3e0);
      std::allocator<char>::~allocator(&local_3ea);
      std::allocator<char>::~allocator(&local_3e9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff860,(char *)in_stack_fffffffffffff858,
                 in_stack_fffffffffffff850);
      pbVar3 = (bool *)(in_RDI + 0x70);
      bVar2 = RangeMap::AddRangeWithTranslation
                        (in_stack_fffffffffffff890,(uint64_t)in_stack_fffffffffffff888,
                         (uint64_t)in_stack_fffffffffffff880,in_stack_fffffffffffff878,
                         in_stack_fffffffffffff870,(bool)in_stack_fffffffffffff86f,
                         in_stack_fffffffffffff8a0);
      local_401 = ~bVar2 & 1;
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)in_stack_fffffffffffff820,pbVar3,(type *)0x17e6c8);
      std::__cxx11::string::~string(local_428);
      std::allocator<char>::~allocator(&local_429);
      bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_400);
      if (!bVar2) {
        testing::Message::Message((Message *)in_stack_fffffffffffff850);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (in_stack_fffffffffffff898,(char *)in_stack_fffffffffffff890,
                   in_stack_fffffffffffff888,in_stack_fffffffffffff880);
        std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)in_stack_fffffffffffff850,TVar6,
                   (char *)CONCAT17(in_stack_fffffffffffff847,
                                    CONCAT16(in_stack_fffffffffffff846,in_stack_fffffffffffff840)),
                   iVar4,(char *)in_stack_fffffffffffff830);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)in_stack_fffffffffffff8a0,(Message *)in_stack_fffffffffffff898);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff820);
        std::__cxx11::string::~string(local_460);
        testing::Message::~Message((Message *)0x17ea87);
      }
      local_124 = (uint)!bVar2;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x17eb18);
      if (local_124 == 0) {
        TVar6 = (Type)((ulong)(in_RDI + 0x40) >> 0x20);
        __a = &local_499;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff860,(char *)in_stack_fffffffffffff858,__a);
        pbVar3 = (bool *)(in_RDI + 0x70);
        uVar1 = RangeMap::AddRangeWithTranslation
                          (in_stack_fffffffffffff890,(uint64_t)in_stack_fffffffffffff888,
                           (uint64_t)in_stack_fffffffffffff880,in_stack_fffffffffffff878,
                           in_stack_fffffffffffff870,(bool)in_stack_fffffffffffff86f,
                           in_stack_fffffffffffff8a0);
        local_471 = ~uVar1 & 1;
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)in_stack_fffffffffffff820,pbVar3,(type *)0x17ebce);
        std::__cxx11::string::~string(local_498);
        std::allocator<char>::~allocator(&local_499);
        bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_470);
        uVar5 = bVar2;
        if (!bVar2) {
          testing::Message::Message((Message *)__a);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (in_stack_fffffffffffff898,(char *)in_stack_fffffffffffff890,
                     in_stack_fffffffffffff888,in_stack_fffffffffffff880);
          std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)__a,TVar6,
                     (char *)CONCAT17(uVar1,CONCAT16(uVar5,in_stack_fffffffffffff840)),iVar4,
                     (char *)in_stack_fffffffffffff830);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)in_stack_fffffffffffff8a0,(Message *)in_stack_fffffffffffff898)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff820);
          std::__cxx11::string::~string(local_4d0);
          testing::Message::~Message((Message *)0x17ed29);
        }
        local_124 = (uint)!bVar2;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x17edba);
        if (local_124 == 0) {
          message = (char *)(in_RDI + 0x40);
          iVar4 = (int)((ulong)&local_509 >> 0x20);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffff860,(char *)in_stack_fffffffffffff858,__a);
          pbVar3 = (bool *)(in_RDI + 0x70);
          bVar2 = RangeMap::AddRangeWithTranslation
                            (in_stack_fffffffffffff890,(uint64_t)in_stack_fffffffffffff888,
                             (uint64_t)in_stack_fffffffffffff880,in_stack_fffffffffffff878,
                             in_stack_fffffffffffff870,(bool)in_stack_fffffffffffff86f,
                             in_stack_fffffffffffff8a0);
          local_4e1 = ~bVar2 & 1;
          testing::AssertionResult::AssertionResult<bool>
                    ((AssertionResult *)in_stack_fffffffffffff820,pbVar3,(type *)0x17ee70);
          std::__cxx11::string::~string(local_508);
          std::allocator<char>::~allocator(&local_509);
          bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_4e0);
          if (!bVar2) {
            testing::Message::Message((Message *)__a);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (in_stack_fffffffffffff898,(char *)in_stack_fffffffffffff890,
                       in_stack_fffffffffffff888,in_stack_fffffffffffff880);
            std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)__a,TVar6,
                       (char *)CONCAT17(uVar1,CONCAT16(uVar5,in_stack_fffffffffffff840)),iVar4,
                       message);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)in_stack_fffffffffffff8a0,
                       (Message *)in_stack_fffffffffffff898);
            testing::internal::AssertHelper::~AssertHelper
                      ((AssertHelper *)in_stack_fffffffffffff820);
            std::__cxx11::string::~string(local_540);
            testing::Message::~Message((Message *)0x17efcb);
          }
          local_124 = (uint)!bVar2;
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x17f059);
        }
      }
    }
  }
  return;
}

Assistant:

TEST_F(RangeMapTest, Translation) {
  map_.AddDualRange(20, 5, 120, "foo");
  CheckConsistency();
  AssertMainMapEquals({
    {20, 25, 120, "foo"}
  });

  ASSERT_TRUE(map2_.AddRangeWithTranslation(20, 5, "translate me", map_, false,
                                            &map3_));

  CheckConsistency();
  AssertMapEquals(map2_, {
    {20, 25, kNoTranslation, "translate me"}
  });
  AssertMapEquals(map3_, {
    {120, 125, kNoTranslation, "translate me"}
  });

  map_.AddDualRange(1000, 30, 1100, "bar");
  ASSERT_TRUE(map2_.AddRangeWithTranslation(1000, 5, "translate me2", map_,
                                            false, &map3_));
  AssertMapEquals(map2_, {
    {20, 25, kNoTranslation, "translate me"},
    {1000, 1005, kNoTranslation, "translate me2"}
  });
  AssertMapEquals(map3_, {
    {120, 125, kNoTranslation, "translate me"},
    {1100, 1105, kNoTranslation, "translate me2"}
  });

  // Starts before base map.
  ASSERT_FALSE(map2_.AddRangeWithTranslation(15, 8, "translate me", map_, false,
                                             &map3_));

  // Extends past base map.
  ASSERT_FALSE(map2_.AddRangeWithTranslation(22, 15, "translate me", map_,
                                             false, &map3_));

  // Starts and ends in base map, but skips range in the middle.
  ASSERT_FALSE(map2_.AddRangeWithTranslation(20, 1000, "translate me", map_,
                                             false, &map3_));
}